

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_randomnumberutil.cpp
# Opt level: O1

void __thiscall
RandomNumberUtil_GetRandomBytes16_Test::TestBody(RandomNumberUtil_GetRandomBytes16_Test *this)

{
  bool bVar1;
  AssertHelper AVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  char *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  _Alloc_hider local_90;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [16];
  ByteData local_78;
  char local_60;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  void *local_50;
  long local_48;
  void *local_38;
  long local_30;
  ByteData local_20;
  
  cfd::core::RandomNumberUtil::GetRandomBytes((int)&local_38);
  cfd::core::RandomNumberUtil::GetRandomBytes((int)&local_50);
  AVar2.data_ = (AssertHelperData *)(local_30 - (long)local_38);
  local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = &DAT_00000010;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_98,"bytes.size()","static_cast<size_t>(size)",
             (unsigned_long *)&stack0xffffffffffffff48,(unsigned_long *)&local_78);
  if (local_98.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffff48);
    if (local_90._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_90._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_randomnumberutil.cpp"
               ,0x26,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_78,(Message *)&stack0xffffffffffffff48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if (((AVar2.data_ != (AssertHelperData *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (AVar2.data_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)AVar2.data_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  AVar2.data_ = (AssertHelperData *)(local_48 - (long)local_50);
  local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = &DAT_00000010;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_98,"bytes2.size()","static_cast<size_t>(size)",
             (unsigned_long *)&stack0xffffffffffffff48,(unsigned_long *)&local_78);
  if (local_98.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffff48);
    if (local_90._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_90._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_randomnumberutil.cpp"
               ,0x27,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_78,(Message *)&stack0xffffffffffffff48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if (AVar2.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (AVar2.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)AVar2.data_ + 8))();
      }
      AVar2.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ByteData::ByteData(&local_78,(vector *)&local_38);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  cfd::core::ByteData::ByteData(&local_20,(vector *)&local_50);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTRNE
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             (char *)AVar2.data_);
  if (AVar2.data_ != (AssertHelperData *)&stack0xffffffffffffff58) {
    operator_delete(AVar2.data_);
  }
  if (local_20.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.ptr_ != local_88) {
    operator_delete(local_98.ptr_);
  }
  if (local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60 == '\0') {
    testing::Message::Message((Message *)&local_98);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_randomnumberutil.cpp"
               ,0x29,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff48,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff48);
    if (local_98.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_98.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_98.ptr_ + 8))();
      }
      local_98.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_50 != (void *)0x0) {
    operator_delete(local_50);
  }
  if (local_38 != (void *)0x0) {
    operator_delete(local_38);
  }
  return;
}

Assistant:

TEST(RandomNumberUtil, GetRandomBytes16) {
  int size = 16;
  std::vector<uint8_t> bytes = RandomNumberUtil::GetRandomBytes(size);
  std::vector<uint8_t> bytes2 = RandomNumberUtil::GetRandomBytes(size);
  EXPECT_EQ(bytes.size(), static_cast<size_t>(size));
  EXPECT_EQ(bytes2.size(), static_cast<size_t>(size));
  EXPECT_STRNE(ByteData(bytes).GetHex().c_str(),
               ByteData(bytes2).GetHex().c_str());
}